

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O0

ostream * operator<<(ostream *out_stream,Date *date)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  int iVar3;
  ostream *poVar4;
  Date *date_local;
  ostream *out_stream_local;
  
  _Var1 = std::setfill<char>('0');
  poVar4 = std::operator<<(out_stream,_Var1._M_c);
  _Var2 = std::setw(4);
  std::operator<<(poVar4,_Var2);
  iVar3 = Date::GetYear(date);
  poVar4 = (ostream *)std::ostream::operator<<(out_stream,iVar3);
  poVar4 = std::operator<<(poVar4,'-');
  _Var2 = std::setw(2);
  std::operator<<(poVar4,_Var2);
  iVar3 = Date::GetMonth(date);
  poVar4 = (ostream *)std::ostream::operator<<(out_stream,iVar3);
  poVar4 = std::operator<<(poVar4,'-');
  _Var2 = std::setw(2);
  std::operator<<(poVar4,_Var2);
  iVar3 = Date::GetDay(date);
  poVar4 = (ostream *)std::ostream::operator<<(out_stream,iVar3);
  return poVar4;
}

Assistant:

ostream& operator<<(ostream& out_stream, const Date& date) {
    out_stream << setfill('0') << setw(4);
    out_stream << date.GetYear() << '-' << setw(2);
    out_stream << date.GetMonth() << '-' << setw(2);

    return out_stream << date.GetDay();
}